

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

int __thiscall QPDFFormFieldObjectHelper::getQuadding(QPDFFormFieldObjectHelper *this)

{
  int iVar1;
  bool bVar2;
  longlong local_98;
  int local_90;
  allocator<char> local_89;
  int result;
  undefined1 local_68 [27];
  bool looked_in_acroform;
  allocator<char> local_41;
  string local_40 [32];
  QPDFObjectHandle fv;
  QPDFFormFieldObjectHelper *this_local;
  
  fv.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/Q",&local_41);
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&stack0xffffffffffffffe0,(string *)this);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_68[0x13] = 0;
  bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&result,"/Q",&local_89);
    getFieldFromAcroForm((QPDFFormFieldObjectHelper *)local_68,(string *)this);
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)&stack0xffffffffffffffe0,(QPDFObjectHandle *)local_68);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
    std::__cxx11::string::~string((string *)&result);
    std::allocator<char>::~allocator(&local_89);
    local_68[0x13] = 1;
  }
  local_90 = 0;
  bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  if (bVar2) {
    QTC::TC("qpdf","QPDFFormFieldObjectHelper Q present",(byte)~local_68[0x13] & 1);
    local_98 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&stack0xffffffffffffffe0);
    local_90 = QIntC::to_int<long_long>(&local_98);
  }
  iVar1 = local_90;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  return iVar1;
}

Assistant:

int
QPDFFormFieldObjectHelper::getQuadding()
{
    QPDFObjectHandle fv = getInheritableFieldValue("/Q");
    bool looked_in_acroform = false;
    if (!fv.isInteger()) {
        fv = getFieldFromAcroForm("/Q");
        looked_in_acroform = true;
    }
    int result = 0;
    if (fv.isInteger()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper Q present", looked_in_acroform ? 0 : 1);
        result = QIntC::to_int(fv.getIntValue());
    }
    return result;
}